

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

int __thiscall crnlib::etc1_optimizer::init(etc1_optimizer *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  float num_indices;
  int iVar4;
  unsigned_short *puVar5;
  float *pfVar6;
  uint *puVar7;
  uint *puVar8;
  results *in_RDX;
  vec3F *this_00;
  float local_50;
  undefined1 local_4c [4];
  uint i_1;
  vec3F fc;
  color_quad_u8 *c;
  undefined1 local_30 [4];
  uint i;
  vec3F avg_color;
  uint n;
  results *result_local;
  params *params_local;
  etc1_optimizer *this_local;
  
  this->m_pParams = (params *)ctx;
  this->m_pResult = in_RDX;
  avg_color.m_s[1] = (float)this->m_pParams->m_num_src_pixels;
  vector<unsigned_char>::resize(&this->m_selectors,(uint)avg_color.m_s[1],false);
  vector<unsigned_char>::resize(&this->m_best_selectors,(uint)avg_color.m_s[1],false);
  vector<unsigned_char>::resize(&this->m_temp_selectors,(uint)avg_color.m_s[1],false);
  vector<unsigned_char>::resize(&(this->m_trial_solution).m_selectors,(uint)avg_color.m_s[1],false);
  vector<unsigned_char>::resize(&(this->m_best_solution).m_selectors,(uint)avg_color.m_s[1],false);
  iVar4 = 0x1f;
  if ((this->m_pParams->m_use_color4 & 1U) != 0) {
    iVar4 = 0xf;
  }
  this->m_limit = iVar4;
  vec<3U,_float>::vec((vec<3U,_float> *)local_30,0.0);
  vector<unsigned_short>::resize(&this->m_luma,(uint)avg_color.m_s[1],false);
  vector<unsigned_int>::resize(this->m_sorted_luma,(uint)avg_color.m_s[1],false);
  vector<unsigned_int>::resize(this->m_sorted_luma + 1,(uint)avg_color.m_s[1],false);
  for (c._4_4_ = 0.0; (uint)c._4_4_ < (uint)avg_color.m_s[1]; c._4_4_ = (float)((int)c._4_4_ + 1)) {
    fc.m_s._4_8_ = this->m_pParams->m_pSrc_pixels + (uint)c._4_4_;
    vec<3U,_float>::vec((vec<3U,_float> *)local_4c,
                        (float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.r,
                        (float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.g,
                        (float)(((color_quad_u8 *)fc.m_s._4_8_)->field_0).field_0.b);
    vec<3U,_float>::operator+=((vec<3U,_float> *)local_30,(vec<3U,_float> *)local_4c);
    bVar1 = *(byte *)fc.m_s._4_8_;
    bVar2 = *(byte *)(fc.m_s._4_8_ + 1);
    bVar3 = *(byte *)(fc.m_s._4_8_ + 2);
    puVar5 = vector<unsigned_short>::operator[](&this->m_luma,(uint)c._4_4_);
    *puVar5 = (ushort)bVar1 + (ushort)bVar2 + (ushort)bVar3;
    pfVar6 = (float *)vector<unsigned_int>::operator[](this->m_sorted_luma,(uint)c._4_4_);
    *pfVar6 = c._4_4_;
  }
  vec<3U,_float>::operator/=((vec<3U,_float> *)local_30,(float)(uint)avg_color.m_s[1]);
  this_00 = &this->m_avg_color;
  vec<3U,_float>::operator=(this_00,(vec<3U,_float> *)local_30);
  pfVar6 = vec<3U,_float>::operator[](this_00,0);
  iVar4 = math::clamp<int>((int)(long)((*pfVar6 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  this->m_br = iVar4;
  pfVar6 = vec<3U,_float>::operator[](this_00,1);
  iVar4 = math::clamp<int>((int)(long)((*pfVar6 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  this->m_bg = iVar4;
  pfVar6 = vec<3U,_float>::operator[](this_00,2);
  iVar4 = math::clamp<int>((int)(long)((*pfVar6 * (float)this->m_limit) / 255.0 + 0.5),0,
                           this->m_limit);
  num_indices = avg_color.m_s[1];
  this->m_bb = iVar4;
  if ((this->m_pParams->super_crn_etc1_pack_params).m_quality < cCRNETCQualitySlow) {
    puVar7 = vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    puVar8 = vector<unsigned_int>::get_ptr(this->m_sorted_luma + 1);
    puVar5 = vector<unsigned_short>::get_ptr(&this->m_luma);
    puVar7 = indirect_radix_sort<unsigned_int,unsigned_short>
                       ((uint)num_indices,puVar7,puVar8,puVar5,0,2,false);
    this->m_pSorted_luma_indices = puVar7;
    puVar7 = vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    this->m_pSorted_luma = puVar7;
    puVar7 = this->m_pSorted_luma_indices;
    puVar8 = vector<unsigned_int>::get_ptr(this->m_sorted_luma);
    if (puVar7 == puVar8) {
      puVar7 = vector<unsigned_int>::get_ptr(this->m_sorted_luma + 1);
      this->m_pSorted_luma = puVar7;
    }
    for (local_50 = 0.0; (uint)local_50 < (uint)avg_color.m_s[1];
        local_50 = (float)((int)local_50 + 1)) {
      puVar5 = vector<unsigned_short>::operator[]
                         (&this->m_luma,this->m_pSorted_luma_indices[(uint)local_50]);
      this->m_pSorted_luma[(uint)local_50] = (uint)*puVar5;
    }
  }
  etc1_solution_coordinates::clear(&(this->m_best_solution).m_coords);
  (this->m_best_solution).m_valid = false;
  (this->m_best_solution).m_error = 0xffffffffffffffff;
  return (int)this;
}

Assistant:

void etc1_optimizer::init(const params& params, results& result)
    {
        m_pParams = &params;
        m_pResult = &result;

        const uint n = m_pParams->m_num_src_pixels;

        m_selectors.resize(n);
        m_best_selectors.resize(n);
        m_temp_selectors.resize(n);
        m_trial_solution.m_selectors.resize(n);
        m_best_solution.m_selectors.resize(n);

        m_limit = m_pParams->m_use_color4 ? 15 : 31;

        vec3F avg_color(0.0f);

        m_luma.resize(n);
        m_sorted_luma[0].resize(n);
        m_sorted_luma[1].resize(n);

        for (uint i = 0; i < n; i++)
        {
            const color_quad_u8& c = m_pParams->m_pSrc_pixels[i];
            const vec3F fc(c.r, c.g, c.b);

            avg_color += fc;

            m_luma[i] = static_cast<uint16>(c.r + c.g + c.b);
            m_sorted_luma[0][i] = i;
        }
        avg_color /= static_cast<float>(n);
        m_avg_color = avg_color;

        m_br = math::clamp<int>(static_cast<uint>(m_avg_color[0] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bg = math::clamp<int>(static_cast<uint>(m_avg_color[1] * m_limit / 255.0f + .5f), 0, m_limit);
        m_bb = math::clamp<int>(static_cast<uint>(m_avg_color[2] * m_limit / 255.0f + .5f), 0, m_limit);

        if (m_pParams->m_quality <= cCRNETCQualityMedium)
        {
            m_pSorted_luma_indices = indirect_radix_sort(n, m_sorted_luma[0].get_ptr(), m_sorted_luma[1].get_ptr(), m_luma.get_ptr(), 0, sizeof(m_luma[0]), false);
            m_pSorted_luma = m_sorted_luma[0].get_ptr();
            if (m_pSorted_luma_indices == m_sorted_luma[0].get_ptr())
            {
                m_pSorted_luma = m_sorted_luma[1].get_ptr();
            }

            for (uint i = 0; i < n; i++)
            {
                m_pSorted_luma[i] = m_luma[m_pSorted_luma_indices[i]];
            }
        }

        m_best_solution.m_coords.clear();
        m_best_solution.m_valid = false;
        m_best_solution.m_error = cUINT64_MAX;
    }